

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosaraju_scc.cpp
# Opt level: O3

void __thiscall KosarajuSCC::set_levels(KosarajuSCC *this,int start,int sink)

{
  pointer piVar1;
  unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  mand_sccs;
  allocator_type local_5d;
  int local_5c;
  _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_58;
  
  piVar1 = (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  local_5c = this->nb_nodes + 1;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_58,
             (long)((int)((ulong)((long)(this->sccs).
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->sccs).
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                   -0x55555555),&local_5c,&local_5d);
  piVar1 = (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_58._M_buckets;
  (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_58._M_bucket_count;
  (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_58._M_before_begin._M_nxt;
  local_58._M_buckets = (__buckets_ptr)0x0;
  local_58._M_bucket_count = 0;
  local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
    if (local_58._M_buckets != (__buckets_ptr)0x0) {
      operator_delete(local_58._M_buckets);
    }
  }
  local_58._M_buckets = &local_58._M_single_bucket;
  local_58._M_bucket_count = 1;
  local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_58._M_element_count = 0;
  local_58._M_rehash_policy._M_max_load_factor = 1.0;
  local_58._M_rehash_policy._M_next_resize = 0;
  local_58._M_single_bucket = (__node_base_ptr)0x0;
  _set_levels(this,start,sink);
  std::
  _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_58);
  return;
}

Assistant:

void KosarajuSCC::set_levels(int start, int sink) {
	levels.clear();
	levels = std::vector<int>(nb_sccs(), nb_nodes + 1);
	// bool *visited = new bool[nb_nodes];
	// memset(visited,false , nb_nodes*sizeof(bool));

	const std::unordered_map<int, bool> mand_sccs;
	// levels[scc_of(sink)] = nb_nodes;
	//_set_levels(start,visited,mand_sccs);
	_set_levels(start, sink);
	// delete[] visited;
}